

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O0

void __thiscall
Js::Utf8SourceInfo::Utf8SourceInfo
          (Utf8SourceInfo *this,ISourceHolder *mappableSource,int32 cchLength,SRCINFO *srcInfo,
          DWORD_PTR secondaryHostSourceContext,ScriptContext *scriptContext,bool isLibraryCode,
          Var scriptSource)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Recycler *allocator;
  ThreadContext *this_00;
  ISourceHolder *pIVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uchar **ppuVar6;
  bool local_da;
  nullptr_t local_80;
  nullptr_t local_78;
  nullptr_t local_70 [3];
  nullptr_t local_58;
  nullptr_t local_50;
  nullptr_t local_48;
  byte local_39;
  ScriptContext *pSStack_38;
  bool isLibraryCode_local;
  ScriptContext *scriptContext_local;
  DWORD_PTR secondaryHostSourceContext_local;
  SRCINFO *srcInfo_local;
  ISourceHolder *pIStack_18;
  int32 cchLength_local;
  ISourceHolder *mappableSource_local;
  Utf8SourceInfo *this_local;
  
  local_39 = isLibraryCode;
  pSStack_38 = scriptContext;
  scriptContext_local = (ScriptContext *)secondaryHostSourceContext;
  secondaryHostSourceContext_local = (DWORD_PTR)srcInfo;
  srcInfo_local._4_4_ = cchLength;
  pIStack_18 = mappableSource;
  mappableSource_local = (ISourceHolder *)this;
  FinalizableObject::FinalizableObject(&this->super_FinalizableObject);
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01de40a8;
  this->m_cchLength = srcInfo_local._4_4_;
  Memory::WriteBarrierPtr<Js::ISourceHolder>::WriteBarrierPtr(&this->sourceHolder,pIStack_18);
  Memory::
  WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::WriteBarrierPtr(&this->functionBodyDictionary);
  local_48 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>_>
  ::WriteBarrierPtr(&this->m_deferredFunctionsDictionary,&local_48);
  local_50 = (nullptr_t)0x0;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::FunctionInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierPtr(&this->topLevelFunctionInfoList,&local_50);
  allocator = ScriptContext::GetRecycler(pSStack_38);
  JsUtil::
  BaseHashSet<const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_const_Js::PropertyRecord_*,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet(&this->boundedPropertyRecordHashSet,allocator,0);
  local_58 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DebugDocument>::WriteBarrierPtr(&this->m_debugDocument,&local_58);
  Memory::WriteBarrierPtr<const_SRCINFO>::WriteBarrierPtr
            (&this->m_srcInfo,(SRCINFO *)secondaryHostSourceContext_local);
  this->m_secondaryHostSourceContext = (Type)scriptContext_local;
  local_70[0] = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierPtr(&this->debugModeSource,local_70);
  this->debugModeSourceLength = 0;
  Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierPtr(&this->m_scriptContext,pSStack_38);
  local_78 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::LineOffsetCache>::WriteBarrierPtr(&this->m_lineOffsetCache,&local_78);
  local_80 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::WriteBarrierPtr
            (&this->callerUtf8SourceInfo,&local_80);
  this->field_0xa8 = this->field_0xa8 & 0xfe;
  this->field_0xa8 = this->field_0xa8 & 0xfd;
  this->field_0xa8 = this->field_0xa8 & 0xfb | (local_39 & 1) << 2;
  this->field_0xa8 = this->field_0xa8 & 0xf7;
  this->field_0xa8 = this->field_0xa8 & 0xef;
  this->field_0xa8 = this->field_0xa8 & 0xdf;
  this->field_0xa8 = this->field_0xa8 & 0xbf;
  this_00 = ScriptContext::GetThreadContext(pSStack_38);
  uVar2 = ThreadContext::NewSourceInfoNumber(this_00);
  this->m_sourceInfoId = uVar2;
  Memory::WriteBarrierPtr<void>::WriteBarrierPtr(&this->sourceRef,scriptSource);
  pIVar5 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
  uVar3 = (*(pIVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])();
  if ((uVar3 & 1) == 0) {
    pIVar5 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
    iVar4 = (*(pIVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(pIVar5,L"Entering Debug Mode");
    Memory::WriteBarrierPtr<const_unsigned_char>::operator=
              (&this->debugModeSource,(uchar *)CONCAT44(extraout_var,iVar4));
    pIVar5 = Memory::WriteBarrierPtr<Js::ISourceHolder>::operator->(&this->sourceHolder);
    iVar4 = (*(pIVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pIVar5,L"Entering Debug Mode");
    this->debugModeSourceLength = CONCAT44(extraout_var_00,iVar4);
    bVar1 = HasSource(this);
    local_da = true;
    if (bVar1) {
      ppuVar6 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                          ((WriteBarrierPtr *)&this->debugModeSource);
      local_da = *ppuVar6 == (uchar *)0x0;
    }
    this->field_0xa8 = this->field_0xa8 & 0xdf | local_da << 5;
  }
  return;
}

Assistant:

Utf8SourceInfo::Utf8SourceInfo(ISourceHolder* mappableSource, int32 cchLength,
        SRCINFO const* srcInfo, DWORD_PTR secondaryHostSourceContext,
        ScriptContext* scriptContext, bool isLibraryCode, Js::Var scriptSource):
        sourceHolder(mappableSource),
        m_cchLength(cchLength),
        m_srcInfo(srcInfo),
        m_secondaryHostSourceContext(secondaryHostSourceContext),
#ifdef ENABLE_SCRIPT_DEBUGGING
        m_debugDocument(nullptr),
#endif
        m_sourceInfoId(scriptContext->GetThreadContext()->NewSourceInfoNumber()),
        m_isCesu8(false),
        m_isLibraryCode(isLibraryCode),
        m_isXDomain(false),
        m_isXDomainString(false),
        m_scriptContext(scriptContext),
        m_lineOffsetCache(nullptr),
        m_deferredFunctionsDictionary(nullptr),
        m_deferredFunctionsInitialized(false),
        topLevelFunctionInfoList(nullptr),
#ifdef ENABLE_SCRIPT_DEBUGGING
        debugModeSource(nullptr),
        debugModeSourceIsEmpty(false),
        debugModeSourceLength(0),
        m_isInDebugMode(false),
#endif
        callerUtf8SourceInfo(nullptr),
        boundedPropertyRecordHashSet(scriptContext->GetRecycler())
#ifndef NTBUILD
        ,sourceRef(scriptSource)
#endif
    {
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (!sourceHolder->IsDeferrable())
        {
            this->debugModeSource = this->sourceHolder->GetSource(_u("Entering Debug Mode"));
            this->debugModeSourceLength = this->sourceHolder->GetByteLength(_u("Entering Debug Mode"));
            this->debugModeSourceIsEmpty = !this->HasSource() || this->debugModeSource == nullptr;
        }
#endif
    }